

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
diligent_spirv_cross::CompilerGLSL::bitcast_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *target_type,
          BaseType expr_type,string *expr)

{
  char (*in_R9) [2];
  diligent_spirv_cross local_1a0 [32];
  undefined1 local_180 [8];
  SPIRType src_type;
  string *expr_local;
  BaseType expr_type_local;
  SPIRType *target_type_local;
  CompilerGLSL *this_local;
  
  src_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)expr;
  if (target_type->basetype == expr_type) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)expr);
  }
  else {
    SPIRType::SPIRType((SPIRType *)local_180,target_type);
    src_type.super_IVariant.self.id = expr_type;
    (*(this->super_Compiler)._vptr_Compiler[0x3c])(local_1a0,this,target_type,(SPIRType *)local_180)
    ;
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
              (__return_storage_ptr__,local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe5b075,
               (char (*) [2])src_type.member_name_cache._M_h._M_single_bucket,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf65f2d,in_R9);
    ::std::__cxx11::string::~string((string *)local_1a0);
    SPIRType::~SPIRType((SPIRType *)local_180);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::bitcast_expression(const SPIRType &target_type, SPIRType::BaseType expr_type,
                                             const std::string &expr)
{
	if (target_type.basetype == expr_type)
		return expr;

	auto src_type = target_type;
	src_type.basetype = expr_type;
	return join(bitcast_glsl_op(target_type, src_type), "(", expr, ")");
}